

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O1

void warning_report(Location *location,string *message)

{
  ulong uVar1;
  char *text;
  int iVar2;
  ostream *poVar3;
  
  uVar1 = (long)location->line - 1;
  if (uVar1 < (ulong)((long)srcfile_abi_cxx11_.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)srcfile_abi_cxx11_.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5)) {
    text = srcfile_abi_cxx11_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar1]._M_dataplus._M_p;
    iVar2 = fprintf(_stderr,"\n%s (%d): ",location->unit);
    fprintf(_stderr,"%s\n",text);
    underline(iVar2 + -1,location->first_column,location->last_column,text);
    fwrite("\nWARNING!\t",10,1,_stderr);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(message->_M_dataplus)._M_p,message->_M_string_length)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    warning_count = warning_count + 1;
    return;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

void warning_report(ast::Location *location, std::string message)
{
	int lineno =  location->line - 1;
	const char *text = srcfile.at(lineno).c_str();
	auto offset = fprintf(stderr, "\n%s (%d): ", location->unit, location->line) - 1;
	fprintf(stderr, "%s\n", text);
	underline(offset, location->first_column, location->last_column, text);
	fprintf(stderr, "\nWARNING!\t");
	std::cerr << message << std::endl;
	warning_count++;
}